

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O2

void Init(string *progname,const_iterator beginargs,const_iterator endargs)

{
  ostream *poVar1;
  long lVar2;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  allocator local_ae3;
  allocator local_ae2;
  allocator local_ae1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  ParseError e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_aa8;
  EitherFlag local_a98;
  string local_a70;
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  directory;
  Flag quiet;
  Flag bare;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  templatedir;
  HelpFlag help;
  ArgumentParser parser;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"In Init");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&templatedir,"",(allocator *)&bare);
  help.super_Flag.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&help.super_Flag.super_FlagBase.super_NamedBase.super_Base.help;
  help.super_Flag.super_FlagBase.super_NamedBase.super_Base.options = None;
  help.super_Flag.super_FlagBase.super_NamedBase.super_Base.matched = false;
  help.super_Flag.super_FlagBase.super_NamedBase.super_Base._13_3_ = 0;
  help.super_Flag.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p._0_1_ = 0;
  args::ArgumentParser::ArgumentParser(&parser,(string *)&templatedir,(string *)&help);
  std::__cxx11::string::~string((string *)&help);
  std::__cxx11::string::~string((string *)&templatedir);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&templatedir,
                 progname," init");
  std::__cxx11::string::_M_assign((string *)&parser.helpParams.programName);
  std::__cxx11::string::~string((string *)&templatedir);
  std::__cxx11::string::string((string *)&quiet,"help",(allocator *)&e);
  std::__cxx11::string::string
            ((string *)&directory,"Display this help menu",(allocator *)&local_ae0);
  bare.super_FlagBase.super_NamedBase.super_Base._8_8_ =
       &bare.super_FlagBase.super_NamedBase.super_Base.help._M_string_length;
  bare.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_ = 0x6801;
  bare.super_FlagBase.super_NamedBase.super_Base.help._M_dataplus._M_p = (pointer)0x0;
  bare.super_FlagBase.super_NamedBase.super_Base.help._M_string_length._0_1_ = 0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)((long)&bare.super_FlagBase.super_NamedBase.super_Base.help.field_2 + 8),
             "help");
  in._M_len = 2;
  in._M_array = (iterator)&bare;
  args::Matcher::Matcher((Matcher *)&templatedir,in);
  args::HelpFlag::HelpFlag
            (&help,(Group *)&parser,(string *)&quiet,(string *)&directory,(Matcher *)&templatedir,
             None);
  args::Matcher::~Matcher((Matcher *)&templatedir);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&bare.super_FlagBase.super_NamedBase.super_Base._vptr_Base + lVar2))
    ;
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&directory);
  std::__cxx11::string::~string((string *)&quiet);
  std::__cxx11::string::string((string *)&directory,"template-directory",(allocator *)&local_a70);
  std::__cxx11::string::string
            ((string *)&e,"directory from which templates will be used",&local_ae3);
  args::EitherFlag::EitherFlag((EitherFlag *)&quiet,"template");
  in_00._M_len = 1;
  in_00._M_array = (iterator)&quiet;
  args::Matcher::Matcher((Matcher *)&bare,in_00);
  local_ae0._M_dataplus._M_p = (pointer)&local_ae0.field_2;
  local_ae0._M_string_length = 0;
  local_ae0.field_2._M_local_buf[0] = '\0';
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag(&templatedir,(Group *)&parser,(string *)&directory,(string *)&e,(Matcher *)&bare,
              &local_ae0,None);
  std::__cxx11::string::~string((string *)&local_ae0);
  args::Matcher::~Matcher((Matcher *)&bare);
  std::__cxx11::string::~string((string *)&quiet.super_FlagBase.super_NamedBase.super_Base.options);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&directory);
  std::__cxx11::string::string((string *)&e,"bare",(allocator *)&local_a70);
  std::__cxx11::string::string((string *)&local_ae0,"create a bare repository",&local_ae3);
  args::EitherFlag::EitherFlag((EitherFlag *)&directory,"bare");
  in_01._M_len = 1;
  in_01._M_array = (iterator)&directory;
  args::Matcher::Matcher((Matcher *)&quiet,in_01);
  args::Flag::Flag(&bare,(Group *)&parser,(string *)&e,&local_ae0,(Matcher *)&quiet,None);
  args::Matcher::~Matcher((Matcher *)&quiet);
  std::__cxx11::string::~string
            ((string *)&directory.super_PositionalBase.super_NamedBase.super_Base.options);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::string((string *)&local_ae0,"quiet",&local_ae3);
  std::__cxx11::string::string((string *)&local_a70,"be quiet",&local_ae2);
  e.super_Error._8_8_ = &local_aa8;
  e.super_Error.super_runtime_error = (runtime_error)0x1;
  e.super_Error._1_1_ = 0x71;
  local_aa8._M_local_buf[0] = '\0';
  args::EitherFlag::EitherFlag(&local_a98,"quiet");
  in_02._M_len = 2;
  in_02._M_array = (iterator)&e;
  args::Matcher::Matcher((Matcher *)&directory,in_02);
  args::Flag::Flag(&quiet,(Group *)&parser,&local_ae0,&local_a70,(Matcher *)&directory,None);
  args::Matcher::~Matcher((Matcher *)&directory);
  lVar2 = 0x30;
  do {
    std::__cxx11::string::~string((string *)(&e.super_Error.super_runtime_error + lVar2));
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::string((string *)&e,"directory",&local_ae3);
  std::__cxx11::string::string((string *)&local_ae0,"The directory to create in",&local_ae2);
  std::__cxx11::string::string((string *)&local_a70,".",&local_ae1);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::Positional(&directory,(Group *)&parser,(string *)&e,&local_ae0,&local_a70,None);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&e);
  args::ArgumentParser::
  ParseArgs<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&parser,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )beginargs._M_current,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )endargs._M_current);
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) | 1;
  poVar1 = std::operator<<((ostream *)&std::cout,"templatedir: ");
  (*templatedir.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,", value: ");
  poVar1 = std::operator<<(poVar1,(string *)&templatedir.value);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"bare: ");
  (**(code **)(CONCAT62(bare.super_FlagBase.super_NamedBase.super_Base._vptr_Base._2_6_,
                        bare.super_FlagBase.super_NamedBase.super_Base._vptr_Base._0_2_) + 0x10))();
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"quiet: ");
  (*quiet.super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"directory: ");
  (*directory.super_PositionalBase.super_NamedBase.super_Base._vptr_Base[2])();
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1,", value: ");
  poVar1 = std::operator<<(poVar1,(string *)&directory.value);
  std::endl<char,std::char_traits<char>>(poVar1);
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~Positional(&directory);
  args::FlagBase::~FlagBase(&quiet.super_FlagBase);
  args::FlagBase::~FlagBase(&bare.super_FlagBase);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag(&templatedir);
  args::FlagBase::~FlagBase((FlagBase *)&help);
  args::ArgumentParser::~ArgumentParser(&parser);
  return;
}

Assistant:

void Init(const std::string &progname, std::vector<std::string>::const_iterator beginargs, std::vector<std::string>::const_iterator endargs)
{
    std::cout << "In Init" << std::endl;
    args::ArgumentParser parser("");
    parser.Prog(progname + " init");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::ValueFlag<std::string> templatedir(parser, "template-directory", "directory from which templates will be used", {"template"});
    args::Flag bare(parser, "bare", "create a bare repository", {"bare"});
    args::Flag quiet(parser, "quiet", "be quiet", {'q', "quiet"});
    args::Positional<std::string> directory(parser, "directory", "The directory to create in", ".");
    try
    {
        parser.ParseArgs(beginargs, endargs);
        std::cout << std::boolalpha;
        std::cout << "templatedir: " << bool{templatedir} << ", value: " << args::get(templatedir) << std::endl;
        std::cout << "bare: " << bool{bare} << std::endl;
        std::cout << "quiet: " << bool{quiet} << std::endl;
        std::cout << "directory: " << bool{directory} << ", value: " << args::get(directory) << std::endl;
    }
    catch (args::Help)
    {
        std::cout << parser;
        return;
    }
    catch (args::ParseError e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return;
    }
}